

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressContinue
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  blockType_e bVar1;
  void *pvVar2;
  unsigned_long_long uVar3;
  ZSTD_dStage ZVar4;
  size_t sVar5;
  XXH64_hash_t XVar6;
  blockProperties_t bp;
  blockProperties_t local_3c;
  
  if (dctx->expected != srcSize) {
    return 0xffffffffffffffb8;
  }
  if ((dstCapacity != 0) && (pvVar2 = dctx->previousDstEnd, pvVar2 != dst)) {
    dctx->dictEnd = pvVar2;
    dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar2) + (long)dst);
    dctx->prefixStart = dst;
    dctx->previousDstEnd = dst;
  }
  switch(dctx->stage) {
  case ZSTDds_getFrameHeaderSize:
    if ((dctx->format == ZSTD_f_zstd1) && ((*src & 0xfffffff0) == 0x184d2a50)) {
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = 8 - srcSize;
      dctx->stage = ZSTDds_decodeSkippableHeader;
    }
    else {
      sVar5 = ZSTD_frameHeaderSize_internal(src,srcSize,dctx->format);
      dctx->headerSize = sVar5;
      if (0xffffffffffffff88 < sVar5) {
        return sVar5;
      }
      memcpy(dctx->headerBuffer,src,srcSize);
      dctx->expected = sVar5 - srcSize;
      dctx->stage = ZSTDds_decodeFrameHeader;
    }
    break;
  case ZSTDds_decodeFrameHeader:
    memcpy((void *)((long)dctx + (dctx->headerSize - srcSize) + 0x271e0),src,srcSize);
    sVar5 = ZSTD_decodeFrameHeader(dctx,dctx->headerBuffer,dctx->headerSize);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    dctx->expected = 3;
    dctx->stage = ZSTDds_decodeBlockHeader;
    break;
  case ZSTDds_decodeBlockHeader:
    sVar5 = ZSTD_getcBlockSize(src,3,&local_3c);
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    dctx->expected = sVar5;
    dctx->bType = local_3c.blockType;
    dctx->rleSize = (ulong)local_3c.origSize;
    if (sVar5 == 0) {
      if (local_3c.lastBlock == 0) {
        dctx->expected = 3;
        ZVar4 = ZSTDds_decodeBlockHeader;
      }
      else if ((dctx->fParams).checksumFlag == 0) {
        dctx->expected = 0;
        ZVar4 = ZSTDds_getFrameHeaderSize;
      }
      else {
        dctx->expected = 4;
        ZVar4 = ZSTDds_checkChecksum;
      }
    }
    else {
      ZVar4 = ZSTDds_decompressLastBlock - (local_3c.lastBlock == 0);
    }
    dctx->stage = ZVar4;
    break;
  case ZSTDds_decompressBlock:
  case ZSTDds_decompressLastBlock:
    bVar1 = dctx->bType;
    if (bVar1 == bt_raw) {
      if (dst != (void *)0x0) {
        sVar5 = 0xffffffffffffffba;
        if (srcSize <= dstCapacity) {
          memcpy(dst,src,srcSize);
          sVar5 = srcSize;
        }
        goto LAB_004bb7b8;
      }
    }
    else {
      if (bVar1 != bt_rle) {
        if (bVar1 != bt_compressed) {
          return 0xffffffffffffffec;
        }
        sVar5 = ZSTD_decompressBlock_internal(dctx,dst,dstCapacity,src,srcSize,1);
        goto LAB_004bb7b8;
      }
      srcSize = dctx->rleSize;
      if (dst != (void *)0x0) {
        sVar5 = 0xffffffffffffffba;
        if (srcSize <= dstCapacity) {
          memset(dst,(uint)*src,srcSize);
          sVar5 = srcSize;
        }
        goto LAB_004bb7b8;
      }
    }
    sVar5 = 0xffffffffffffffb6;
    if (srcSize == 0) {
      sVar5 = 0;
    }
LAB_004bb7b8:
    if (0xffffffffffffff88 < sVar5) {
      return sVar5;
    }
    dctx->decodedSize = dctx->decodedSize + sVar5;
    if ((dctx->fParams).checksumFlag != 0) {
      XXH64_update(&dctx->xxhState,dst,sVar5);
    }
    if (dctx->stage == ZSTDds_decompressLastBlock) {
      uVar3 = (dctx->fParams).frameContentSize;
      if ((uVar3 != 0xffffffffffffffff) && (dctx->decodedSize != uVar3)) {
        return 0xffffffffffffffec;
      }
      if ((dctx->fParams).checksumFlag != 0) {
        dctx->expected = 4;
        dctx->stage = ZSTDds_checkChecksum;
        return sVar5;
      }
      dctx->expected = 0;
      dctx->stage = ZSTDds_getFrameHeaderSize;
      return sVar5;
    }
    dctx->stage = ZSTDds_decodeBlockHeader;
    dctx->expected = 3;
    dctx->previousDstEnd = (void *)((long)dst + sVar5);
    return sVar5;
  case ZSTDds_checkChecksum:
    XVar6 = XXH64_digest(&dctx->xxhState);
    if (*src != (int)XVar6) {
      return 0xffffffffffffffea;
    }
  case ZSTDds_skipFrame:
    dctx->expected = 0;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    break;
  case ZSTDds_decodeSkippableHeader:
    memcpy((void *)((long)dctx + (0x271e8 - srcSize)),src,srcSize);
    dctx->expected = (ulong)*(uint *)(dctx->headerBuffer + 4);
    dctx->stage = ZSTDds_skipFrame;
    break;
  default:
    return 0xffffffffffffffff;
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressContinue(ZSTD_DCtx* dctx, void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    DEBUGLOG(5, "ZSTD_decompressContinue (srcSize:%u)", (unsigned)srcSize);
    /* Sanity check */
    if (srcSize != dctx->expected)
        return ERROR(srcSize_wrong);  /* not allowed */
    if (dstCapacity) ZSTD_checkContinuity(dctx, dst);

    switch (dctx->stage)
    {
    case ZSTDds_getFrameHeaderSize :
        assert(src != NULL);
        if (dctx->format == ZSTD_f_zstd1) {  /* allows header */
            assert(srcSize >= ZSTD_FRAMEIDSIZE);  /* to read skippable magic number */
            if ((MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {        /* skippable frame */
                memcpy(dctx->headerBuffer, src, srcSize);
                dctx->expected = ZSTD_SKIPPABLEHEADERSIZE - srcSize;  /* remaining to load to get full skippable frame header */
                dctx->stage = ZSTDds_decodeSkippableHeader;
                return 0;
        }   }
        dctx->headerSize = ZSTD_frameHeaderSize_internal(src, srcSize, dctx->format);
        if (ZSTD_isError(dctx->headerSize)) return dctx->headerSize;
        memcpy(dctx->headerBuffer, src, srcSize);
        dctx->expected = dctx->headerSize - srcSize;
        dctx->stage = ZSTDds_decodeFrameHeader;
        return 0;

    case ZSTDds_decodeFrameHeader:
        assert(src != NULL);
        memcpy(dctx->headerBuffer + (dctx->headerSize - srcSize), src, srcSize);
        CHECK_F(ZSTD_decodeFrameHeader(dctx, dctx->headerBuffer, dctx->headerSize));
        dctx->expected = ZSTD_blockHeaderSize;
        dctx->stage = ZSTDds_decodeBlockHeader;
        return 0;

    case ZSTDds_decodeBlockHeader:
        {   blockProperties_t bp;
            size_t const cBlockSize = ZSTD_getcBlockSize(src, ZSTD_blockHeaderSize, &bp);
            if (ZSTD_isError(cBlockSize)) return cBlockSize;
            dctx->expected = cBlockSize;
            dctx->bType = bp.blockType;
            dctx->rleSize = bp.origSize;
            if (cBlockSize) {
                dctx->stage = bp.lastBlock ? ZSTDds_decompressLastBlock : ZSTDds_decompressBlock;
                return 0;
            }
            /* empty block */
            if (bp.lastBlock) {
                if (dctx->fParams.checksumFlag) {
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0; /* end of frame */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->expected = ZSTD_blockHeaderSize;  /* jump to next header */
                dctx->stage = ZSTDds_decodeBlockHeader;
            }
            return 0;
        }

    case ZSTDds_decompressLastBlock:
    case ZSTDds_decompressBlock:
        DEBUGLOG(5, "ZSTD_decompressContinue: case ZSTDds_decompressBlock");
        {   size_t rSize;
            switch(dctx->bType)
            {
            case bt_compressed:
                DEBUGLOG(5, "ZSTD_decompressContinue: case bt_compressed");
                rSize = ZSTD_decompressBlock_internal(dctx, dst, dstCapacity, src, srcSize, /* frame */ 1);
                break;
            case bt_raw :
                rSize = ZSTD_copyRawBlock(dst, dstCapacity, src, srcSize);
                break;
            case bt_rle :
                rSize = ZSTD_setRleBlock(dst, dstCapacity, *(const BYTE*)src, dctx->rleSize);
                break;
            case bt_reserved :   /* should never happen */
            default:
                return ERROR(corruption_detected);
            }
            if (ZSTD_isError(rSize)) return rSize;
            DEBUGLOG(5, "ZSTD_decompressContinue: decoded size from block : %u", (unsigned)rSize);
            dctx->decodedSize += rSize;
            if (dctx->fParams.checksumFlag) XXH64_update(&dctx->xxhState, dst, rSize);

            if (dctx->stage == ZSTDds_decompressLastBlock) {   /* end of frame */
                DEBUGLOG(4, "ZSTD_decompressContinue: decoded size from frame : %u", (unsigned)dctx->decodedSize);
                if (dctx->fParams.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN) {
                    if (dctx->decodedSize != dctx->fParams.frameContentSize) {
                        return ERROR(corruption_detected);
                }   }
                if (dctx->fParams.checksumFlag) {  /* another round for frame checksum */
                    dctx->expected = 4;
                    dctx->stage = ZSTDds_checkChecksum;
                } else {
                    dctx->expected = 0;   /* ends here */
                    dctx->stage = ZSTDds_getFrameHeaderSize;
                }
            } else {
                dctx->stage = ZSTDds_decodeBlockHeader;
                dctx->expected = ZSTD_blockHeaderSize;
                dctx->previousDstEnd = (char*)dst + rSize;
            }
            return rSize;
        }

    case ZSTDds_checkChecksum:
        assert(srcSize == 4);  /* guaranteed by dctx->expected */
        {   U32 const h32 = (U32)XXH64_digest(&dctx->xxhState);
            U32 const check32 = MEM_readLE32(src);
            DEBUGLOG(4, "ZSTD_decompressContinue: checksum : calculated %08X :: %08X read", (unsigned)h32, (unsigned)check32);
            if (check32 != h32) return ERROR(checksum_wrong);
            dctx->expected = 0;
            dctx->stage = ZSTDds_getFrameHeaderSize;
            return 0;
        }

    case ZSTDds_decodeSkippableHeader:
        assert(src != NULL);
        assert(srcSize <= ZSTD_SKIPPABLEHEADERSIZE);
        memcpy(dctx->headerBuffer + (ZSTD_SKIPPABLEHEADERSIZE - srcSize), src, srcSize);   /* complete skippable header */
        dctx->expected = MEM_readLE32(dctx->headerBuffer + ZSTD_FRAMEIDSIZE);   /* note : dctx->expected can grow seriously large, beyond local buffer size */
        dctx->stage = ZSTDds_skipFrame;
        return 0;

    case ZSTDds_skipFrame:
        dctx->expected = 0;
        dctx->stage = ZSTDds_getFrameHeaderSize;
        return 0;

    default:
        assert(0);   /* impossible */
        return ERROR(GENERIC);   /* some compiler require default to do something */
    }
}